

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_buildCTable_wksp
                 (HUF_CElt *CTable,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  U32 UVar1;
  rankPos *rankPosition;
  nodeElt *huffNode_00;
  int in_ECX;
  uint in_EDX;
  uint *in_R8;
  size_t *in_R9;
  U32 unaff_retaddr;
  int unaff_retaddr_00;
  nodeElt *in_stack_00000008;
  int nonNullRank;
  nodeElt *huffNode;
  nodeElt *huffNode0;
  HUF_buildCTable_wksp_tables *wksp_tables;
  size_t in_stack_ffffffffffffffc8;
  undefined8 in_stack_fffffffffffffff8;
  ulong uVar2;
  U32 maxNbBits_00;
  
  maxNbBits_00 = (U32)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  rankPosition = (rankPos *)HUF_alignUpWorkspace(in_R8,in_R9,in_stack_ffffffffffffffc8);
  huffNode_00 = (nodeElt *)(rankPosition + 2);
  if (in_R9 < (size_t *)0x1300) {
    uVar2 = 0xffffffffffffffbe;
  }
  else {
    if (in_ECX == 0) {
      in_ECX = 0xb;
    }
    if (in_EDX < 0x100) {
      memset(rankPosition,0,0x1000);
      HUF_sort((nodeElt *)CONCAT44(in_EDX,in_ECX),in_R8,(U32)((ulong)in_R9 >> 0x20),rankPosition);
      HUF_buildTree(huffNode_00,in_EDX);
      UVar1 = HUF_setMaxHeight(huffNode0,huffNode._4_4_,(U32)huffNode);
      if (UVar1 < 0xd) {
        HUF_buildCTableFromTree
                  ((HUF_CElt *)CONCAT44(huffNode._4_4_,(U32)huffNode),in_stack_00000008,
                   unaff_retaddr_00,unaff_retaddr,maxNbBits_00);
        uVar2 = (ulong)UVar1;
      }
      else {
        uVar2 = 0xffffffffffffffff;
      }
    }
    else {
      uVar2 = 0xffffffffffffffd2;
    }
  }
  return uVar2;
}

Assistant:

size_t
HUF_buildCTable_wksp(HUF_CElt* CTable, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits,
                     void* workSpace, size_t wkspSize)
{
    HUF_buildCTable_wksp_tables* const wksp_tables =
        (HUF_buildCTable_wksp_tables*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(U32));
    nodeElt* const huffNode0 = wksp_tables->huffNodeTbl;
    nodeElt* const huffNode = huffNode0+1;
    int nonNullRank;

    HUF_STATIC_ASSERT(HUF_CTABLE_WORKSPACE_SIZE == sizeof(HUF_buildCTable_wksp_tables));

    DEBUGLOG(5, "HUF_buildCTable_wksp (alphabet size = %u)", maxSymbolValue+1);

    /* safety checks */
    if (wkspSize < sizeof(HUF_buildCTable_wksp_tables))
        return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX)
        return ERROR(maxSymbolValue_tooLarge);
    ZSTD_memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue, wksp_tables->rankPosition);
    DEBUGLOG(6, "sorted symbols completed (%zu symbols)", showHNodeSymbols(huffNode, maxSymbolValue+1));

    /* build tree */
    nonNullRank = HUF_buildTree(huffNode, maxSymbolValue);

    /* determine and enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, (U32)nonNullRank, maxNbBits);
    if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */

    HUF_buildCTableFromTree(CTable, huffNode, nonNullRank, maxSymbolValue, maxNbBits);

    return maxNbBits;
}